

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O3

FString ExpandEnvVars(char *searchpathstring)

{
  BYTE BVar1;
  FString __name;
  int iVar2;
  char *in_RAX;
  char *pcVar3;
  size_t len;
  char *tail;
  BYTE *__s;
  BYTE *in_RSI;
  FString varname;
  FString local_38;
  
  if (in_RSI == (BYTE *)0x0) {
    in_RSI = "";
  }
  else {
    local_38.Chars = in_RAX;
    pcVar3 = strchr((char *)in_RSI,0x24);
    if (pcVar3 != (char *)0x0) {
      FString::FString((FString *)searchpathstring,(char *)in_RSI,(long)pcVar3 - (long)in_RSI);
      BVar1 = *in_RSI;
      while( true ) {
        if (BVar1 == '\0') {
          return (FString)searchpathstring;
        }
        len = strspn(pcVar3 + 1,"01234567890ABCDEFGHIJKLMNOPQRSTUVWXYZ_abcdefghijklmnopqrstuvwxyz");
        if (len == 0) {
          FString::operator+=((FString *)searchpathstring,'$');
        }
        else {
          FString::FString(&local_38,pcVar3 + 1,len);
          __name.Chars = local_38.Chars;
          iVar2 = strcasecmp(local_38.Chars,"progdir");
          if (iVar2 == 0) {
            FString::operator+=((FString *)searchpathstring,&progdir);
          }
          else {
            tail = getenv(__name.Chars);
            if ((tail != (char *)0x0) && (*tail != '\0')) {
              FString::operator+=((FString *)searchpathstring,tail);
            }
          }
          FString::~FString(&local_38);
        }
        __s = (BYTE *)(pcVar3 + len + 1);
        pcVar3 = strchr((char *)__s,0x24);
        if (pcVar3 == (char *)0x0) break;
        FString::FString(&local_38,(char *)__s,(long)pcVar3 - (long)__s);
        FString::operator+=((FString *)searchpathstring,&local_38);
        FString::~FString(&local_38);
        BVar1 = *__s;
      }
      if (*__s == '\0') {
        return (FString)searchpathstring;
      }
      FString::operator+=((FString *)searchpathstring,(char *)__s);
      return (FString)searchpathstring;
    }
  }
  FString::FString((FString *)searchpathstring,(char *)in_RSI);
  return (FString)searchpathstring;
}

Assistant:

FString ExpandEnvVars(const char *searchpathstring)
{
	static const char envvarnamechars[] =
		"01234567890"
		"ABCDEFGHIJKLMNOPQRSTUVWXYZ"
		"_"
		"abcdefghijklmnopqrstuvwxyz";

	if (searchpathstring == NULL)
		return FString("");

	const char *dollar = strchr(searchpathstring, '$');
	if (dollar == NULL)
	{
		return FString(searchpathstring);
	}

	const char *nextchars = searchpathstring;
	FString out = FString(searchpathstring, dollar - searchpathstring);
	while ( (dollar != NULL) && (*nextchars != 0) )
	{
		size_t length = strspn(dollar + 1, envvarnamechars);
		if (length != 0)
		{
			FString varname = FString(dollar + 1, length);
			if (stricmp(varname, "progdir") == 0)
			{
				out += progdir;
			}
			else
			{
				char *varvalue = getenv(varname);
				if ( (varvalue != NULL) && (strlen(varvalue) != 0) )
				{
					out += varvalue;
				}
			}
		}
		else
		{
			out += '$';
		}
		nextchars = dollar + length + 1;
		dollar = strchr(nextchars, '$');
		if (dollar != NULL)
		{
			out += FString(nextchars, dollar - nextchars);
		}
	}
	if (*nextchars != 0)
	{
		out += nextchars;
	}
	return out;
}